

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::anon_unknown_15::ConsoleReporter::log_contexts(ConsoleReporter *this)

{
  ostream *s;
  IContextScope **ppIVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  detail::g_infoContexts::__tls_init();
  uVar4 = (uint)((ulong)(*(long *)(in_FS_OFFSET + -0x28) - *(long *)(in_FS_OFFSET + -0x30)) >> 3);
  if (uVar4 != 0) {
    ppIVar1 = IReporter::get_active_contexts();
    s = this->s;
    Color::operator<<(s,None);
    std::__ostream_insert<char,std::char_traits<char>>(s,"  logged: ",10);
    if (0 < (int)uVar4) {
      uVar5 = 0;
      do {
        pcVar3 = "          ";
        if (uVar5 == 0) {
          pcVar3 = "";
        }
        lVar2 = 10;
        if (uVar5 == 0) {
          lVar2 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->s,pcVar3,lVar2);
        (*ppIVar1[uVar5]->_vptr_IContextScope[2])(ppIVar1[uVar5],this->s);
        std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
        uVar5 = uVar5 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar5);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << Color::None << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << "\n";
                }
            }

            s << "\n";
        }